

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_size_quantity_Test::TestBody
          (PriceUpdateDecoderTest_test_decode_size_quantity_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  long local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  Type local_a8 [2];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  PriceField price_field;
  allocator<char> local_69;
  string local_68 [32];
  FieldDef local_48 [8];
  FieldDef field_def;
  unsigned_long local_18;
  uint64_t size;
  PriceUpdateDecoderTest_test_decode_size_quantity_Test *this_local;
  
  local_18 = 0xd95d302789527;
  size = (uint64_t)this;
  bidfx_public_api::tools::Varint::WriteU64
            ((OutputStream *)&(this->super_PriceUpdateDecoderTest).field_0x18,0xd95d302789527);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"field",&local_69);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_48,1,0x4c,local_68,0x56,0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&gtest_ar.message_,
             (FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_a8[1] = 1;
  local_a8[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_a0,"PriceField::LONG","price_field.GetType()",local_a8 + 1,
             local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  local_d0 = bidfx_public_api::price::PriceField::GetLong();
  testing::internal::EqHelper<false>::Compare<unsigned_long,long>
            ((EqHelper<false> *)local_c8,"size","price_field.GetLong()",&local_18,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&gtest_ar.message_);
  FieldDef::~FieldDef(local_48);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_size_quantity)
{
    uint64_t size = 3823908209333543L;
    Varint::WriteU64(buffer, size);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::LONG, "field", FieldEncodingEnum::VARINT, 0);
    PriceField price_field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::LONG, price_field.GetType());
    EXPECT_EQ(size, price_field.GetLong());
}